

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_t __n;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *__data;
  pointer pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_b8.field_2;
  uVar6 = 0;
  local_58 = __return_storage_ptr__;
  do {
    pcVar8 = (input->_M_dataplus)._M_p;
    __n = input->_M_string_length - uVar6;
    if (input->_M_string_length < uVar6 || __n == 0) goto LAB_00190511;
    pvVar2 = memchr(pcVar8 + uVar6,10,__n);
    lVar5 = (long)pvVar2 - (long)pcVar8;
    if (lVar5 == -1 || pvVar2 == (void *)0x0) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,input,0,lVar5 + 1U);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_50,(leader->_M_dataplus)._M_p,leader->_M_string_length);
    local_b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar4) {
      local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_b8._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_98,input,lVar5 + 1U,0xffffffffffffffff);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      uVar7 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_98._M_string_length + local_b8._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar7 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_98._M_string_length + local_b8._M_string_length) goto LAB_00190431;
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_98,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    }
    else {
LAB_00190431:
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_b8,local_98._M_dataplus._M_p,local_98._M_string_length);
    }
    local_78._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar4) {
      local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    paVar4->_M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (input,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar6 = lVar5 + leader->_M_string_length;
  } while (uVar6 != 0xffffffffffffffff);
  pcVar8 = (input->_M_dataplus)._M_p;
LAB_00190511:
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  paVar1 = &input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 == paVar1) {
    uVar7 = *(undefined8 *)((long)&input->field_2 + 8);
    (local_58->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_58->field_2 + 8) = uVar7;
  }
  else {
    (local_58->_M_dataplus)._M_p = pcVar8;
    (local_58->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58->_M_string_length = input->_M_string_length;
  (input->_M_dataplus)._M_p = (pointer)paVar1;
  input->_M_string_length = 0;
  (input->field_2)._M_local_buf[0] = '\0';
  return local_58;
}

Assistant:

CLI11_INLINE std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}